

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * selectOpName(int id)

{
  char *local_18;
  char *z;
  int id_local;
  
  if (id == 0x80) {
    local_18 = "UNION ALL";
  }
  else if (id == 0x81) {
    local_18 = "EXCEPT";
  }
  else if (id == 0x82) {
    local_18 = "INTERSECT";
  }
  else {
    local_18 = "UNION";
  }
  return local_18;
}

Assistant:

static const char *selectOpName(int id){
  char *z;
  switch( id ){
    case TK_ALL:       z = "UNION ALL";   break;
    case TK_INTERSECT: z = "INTERSECT";   break;
    case TK_EXCEPT:    z = "EXCEPT";      break;
    default:           z = "UNION";       break;
  }
  return z;
}